

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::TrimCapabilitiesPass::TrimCapabilitiesPass(TrimCapabilitiesPass *this)

{
  long lVar1;
  undefined1 local_4a;
  undefined1 local_49;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_48;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__TrimCapabilitiesPass_003ea840;
  (this->supportedCapabilities_).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->supportedCapabilities_).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->supportedCapabilities_).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->supportedCapabilities_).size_ = 0;
  lVar1 = 0;
  do {
    EnumSet<spv::Capability>::insert
              (&local_48,&this->supportedCapabilities_,
               (Capability *)((long)kSupportedCapabilities._M_elems + lVar1));
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x78);
  (this->forbiddenCapabilities_).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->forbiddenCapabilities_).size_ = 0;
  (this->forbiddenCapabilities_).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->forbiddenCapabilities_).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  EnumSet<spv::Capability>::insert
            (&local_48,&this->forbiddenCapabilities_,kForbiddenCapabilities._M_elems);
  (this->untouchableCapabilities_).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->untouchableCapabilities_).size_ = 0;
  (this->untouchableCapabilities_).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->untouchableCapabilities_).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  EnumSet<spv::Capability>::insert
            (&local_48,&this->untouchableCapabilities_,kUntouchableCapabilities._M_elems);
  std::
  _Hashtable<spv::Op,std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>,std::allocator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>>,std::__detail::_Select1st,std::equal_to<spv::Op>,spvtools::opt::ClassEnumHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::
  _Hashtable<std::pair<spv::Op,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>const*>
            ((_Hashtable<spv::Op,std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>,std::allocator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>>,std::__detail::_Select1st,std::equal_to<spv::Op>,spvtools::opt::ClassEnumHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->opcodeHandlers_,kOpcodeHandlers,&typeinfo,0,&local_48,&local_49,&local_4a);
  return;
}

Assistant:

TrimCapabilitiesPass::TrimCapabilitiesPass()
    : supportedCapabilities_(
          TrimCapabilitiesPass::kSupportedCapabilities.cbegin(),
          TrimCapabilitiesPass::kSupportedCapabilities.cend()),
      forbiddenCapabilities_(
          TrimCapabilitiesPass::kForbiddenCapabilities.cbegin(),
          TrimCapabilitiesPass::kForbiddenCapabilities.cend()),
      untouchableCapabilities_(
          TrimCapabilitiesPass::kUntouchableCapabilities.cbegin(),
          TrimCapabilitiesPass::kUntouchableCapabilities.cend()),
      opcodeHandlers_(kOpcodeHandlers.cbegin(), kOpcodeHandlers.cend()) {}